

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O2

void textblock_to_file(textblock *tb,ang_file *f,wchar_t indent,wchar_t wrap_at)

{
  wchar_t wVar1;
  char *s;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  size_t *line_lengths;
  size_t *line_starts;
  wchar_t local_44;
  size_t local_40;
  char *local_38;
  
  line_starts = (size_t *)0x0;
  line_lengths = (size_t *)0x0;
  if (wrap_at - indent != 0 && indent <= wrap_at) {
    local_40 = textblock_calculate_lines
                         (tb,&line_starts,&line_lengths,(ulong)(uint)(wrap_at - indent));
    wVar1 = text_wcsz();
    s = (char *)mem_alloc((long)(wVar1 + L'\x01'));
    local_38 = s + 1;
    local_44 = indent;
    for (sVar3 = 0; sVar3 != local_40; sVar3 = sVar3 + 1) {
      if (L'\0' < local_44) {
        file_putf(f,"%*c",(ulong)(uint)local_44,0x20);
      }
      for (uVar4 = 0; uVar4 < line_lengths[sVar3]; uVar4 = uVar4 + 1) {
        wVar1 = text_wctomb(s,tb->text[line_starts[sVar3] + uVar4]);
        if (wVar1 < L'\x01') {
          *s = ' ';
          pcVar2 = local_38;
        }
        else {
          pcVar2 = s + (uint)wVar1;
        }
        *pcVar2 = '\0';
        file_putf(f,"%s",s);
      }
      file_putf(f,"\n");
    }
    mem_free(s);
    mem_free(line_starts);
    mem_free(line_lengths);
    return;
  }
  __assert_fail("width > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-textblock.c"
                ,0x14a,"void textblock_to_file(textblock *, ang_file *, int, int)");
}

Assistant:

void textblock_to_file(textblock *tb, ang_file *f, int indent, int wrap_at)
{
	size_t *line_starts = NULL;
	size_t *line_lengths = NULL;

	size_t n_lines, i, j;
	char *mbbuf;

	int width = wrap_at - indent;
	assert(width > 0);

	n_lines = textblock_calculate_lines(tb, &line_starts, &line_lengths, width);
	mbbuf = mem_alloc(text_wcsz() + 1);

	for (i = 0; i < n_lines; i++) {
		if (indent > 0) {
			file_putf(f, "%*c", indent, ' ');
		}
		for (j = 0; j < line_lengths[i]; ++j) {
			int nc = text_wctomb(mbbuf,
				tb->text[line_starts[i] + j]);

			if (nc > 0) {
				mbbuf[nc] = 0;
			} else {
				mbbuf[0] = ' ';
				mbbuf[1] = 0;
			}
			file_putf(f, "%s", mbbuf);
		}
		file_putf(f, "\n");
	}

	mem_free(mbbuf);
	mem_free(line_starts);
	mem_free(line_lengths);
}